

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O0

void rw::hAnimFrameWrite(Stream *stream,Animation *anim)

{
  void *pvVar1;
  int local_24;
  int32 i;
  HAnimKeyFrame *frames;
  Animation *anim_local;
  Stream *stream_local;
  
  pvVar1 = anim->keyframes;
  for (local_24 = 0; local_24 < anim->numFrames; local_24 = local_24 + 1) {
    Stream::writeF32(stream,*(float32 *)((long)pvVar1 + (long)local_24 * 0x28 + 8));
    Stream::write32(stream,(void *)((long)pvVar1 + (long)local_24 * 0x28 + 0xc),0x10);
    Stream::write32(stream,(void *)((long)pvVar1 + (long)local_24 * 0x28 + 0x1c),0xc);
    Stream::writeI32(stream,(int)((*(long *)((long)pvVar1 + (long)local_24 * 0x28) - (long)pvVar1) /
                                 0x28) * 0x24);
  }
  return;
}

Assistant:

static void
hAnimFrameWrite(Stream *stream, Animation *anim)
{
	HAnimKeyFrame *frames = (HAnimKeyFrame*)anim->keyframes;
	for(int32 i = 0; i < anim->numFrames; i++){
		stream->writeF32(frames[i].time);
		stream->write32(&frames[i].q, 4*4);
		stream->write32(&frames[i].t, 3*4);
		stream->writeI32((frames[i].prev - frames)*0x24);
	}
}